

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

Frag __thiscall re2::Compiler::ByteRange(Compiler *this,int lo,int hi,bool foldcase)

{
  uint32_t begin;
  PatchList end;
  undefined1 in_CL;
  PODArray<re2::Prog::Inst> *in_RDI;
  int in_stack_00000014;
  int id;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined3 in_stack_ffffffffffffffe4;
  uint uVar1;
  Frag local_8;
  
  uVar1 = CONCAT13(in_CL,in_stack_ffffffffffffffe4) & 0x1ffffff;
  begin = AllocInst((Compiler *)CONCAT17(foldcase,_id),in_stack_00000014);
  if ((int)begin < 0) {
    local_8 = NoMatch((Compiler *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  else {
    PODArray<re2::Prog::Inst>::operator[](in_RDI,in_stack_ffffffffffffffcc);
    Prog::Inst::InitByteRange
              ((Inst *)CONCAT44(uVar1,begin),in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,
               (int)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI);
    end = PatchList::Mk(begin << 1);
    Frag::Frag(&local_8,begin,end);
  }
  return local_8;
}

Assistant:

Frag Compiler::ByteRange(int lo, int hi, bool foldcase) {
  int id = AllocInst(1);
  if (id < 0)
    return NoMatch();
  inst_[id].InitByteRange(lo, hi, foldcase, 0);
  return Frag(id, PatchList::Mk(id << 1));
}